

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlExpandPEsInEntityValue(xmlParserCtxtPtr ctxt,xmlSBuf *buf,xmlChar *str,int length,int depth)

{
  byte bVar1;
  xmlEntityType xVar2;
  getParameterEntitySAXFunc p_Var3;
  xmlEntityPtr pxVar4;
  int iVar5;
  uint uVar6;
  xmlChar *pxVar7;
  xmlEntityPtr pxVar8;
  xmlParserInputPtr pxVar9;
  xmlParserInputPtr *ppxVar10;
  size_t sVar11;
  unsigned_long uVar12;
  byte *pbVar13;
  ulong uVar14;
  int iVar15;
  byte *pbVar16;
  byte *local_90;
  xmlParserInputPtr local_88;
  xmlEntityPtr local_80;
  byte *local_78;
  size_t local_70;
  xmlParserInputPtr *local_68;
  xmlParserInputPtr local_60;
  xmlChar *local_58;
  xmlSBuf *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (str != (xmlChar *)0x0) {
    iVar5 = 0x28;
    if ((ctxt->options & 0x80000) == 0) {
      iVar5 = 0x14;
    }
    local_90 = str;
    if (iVar5 <= depth) {
      xmlFatalErrMsg(ctxt,XML_ERR_RESOURCE_LIMIT,"Maximum entity nesting depth exceeded");
      return;
    }
    pbVar16 = str + length;
    while( true ) {
      iVar15 = (int)str;
      iVar5 = (int)local_90;
      if ((pbVar16 <= local_90) || (1 < ctxt->disableSAX)) break;
      bVar1 = *local_90;
      if ((char)bVar1 < '\0') {
        uVar6 = xmlUTF8MultibyteLen(ctxt,local_90,"invalid character in entity value\n");
        if (uVar6 == 0) {
LAB_00131694:
          if (str < local_90) {
            xmlSBufAddString(buf,str,(int)local_90 - iVar15);
          }
          xmlSBufAddReplChar(buf);
          local_90 = local_90 + 1;
          str = local_90;
        }
        else {
          local_90 = local_90 + uVar6;
        }
      }
      else {
        uVar6 = (uint)bVar1;
        if (uVar6 == 0x26) {
          if (local_90[1] == 0x23) {
            if (str < local_90) {
              xmlSBufAddString(buf,str,iVar5 - iVar15);
            }
            iVar5 = xmlParseStringCharRef(ctxt,&local_90);
            if (iVar5 == 0) {
              return;
            }
            xmlSBufAddChar(buf,iVar5);
            str = local_90;
          }
          else {
            local_90 = local_90 + 1;
            pxVar7 = xmlParseStringName(ctxt,&local_90);
            if ((pxVar7 == (xmlChar *)0x0) ||
               (pbVar13 = local_90 + 1, bVar1 = *local_90, local_90 = pbVar13, bVar1 != 0x3b)) {
              xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_CHAR_ERROR,
                             "EntityValue: \'&\' forbidden except for entities references\n");
LAB_0013184d:
              (*xmlFree)(pxVar7);
              return;
            }
            (*xmlFree)(pxVar7);
          }
        }
        else if (uVar6 == 0x25) {
          if ((str < local_90) &&
             (xmlSBufAddString(buf,str,iVar5 - iVar15), local_90 == (byte *)0x0)) {
            return;
          }
          if (*local_90 != 0x25) {
            return;
          }
          local_78 = local_90 + 1;
          local_50 = buf;
          pxVar7 = xmlParseStringName(ctxt,&local_78);
          pbVar13 = local_78;
          if (pxVar7 == (xmlChar *)0x0) {
            xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"xmlParseStringPEReference: no name\n");
            return;
          }
          if (*local_78 != 0x3b) {
            xmlFatalErr(ctxt,XML_ERR_ENTITYREF_SEMICOL_MISSING,(char *)0x0);
            goto LAB_0013184d;
          }
          ctxt->hasPErefs = 1;
          if (((ctxt->sax == (_xmlSAXHandler *)0x0) ||
              (p_Var3 = ctxt->sax->getParameterEntity, p_Var3 == (getParameterEntitySAXFunc)0x0)) ||
             (pxVar8 = (*p_Var3)(ctxt->userData,pxVar7), pxVar8 == (xmlEntityPtr)0x0)) {
            xmlHandleUndeclaredEntity(ctxt,pxVar7);
            pxVar8 = (xmlEntityPtr)0x0;
          }
          else {
            local_80 = pxVar8;
            if ((pxVar8->etype & ~XML_INTERNAL_GENERAL_ENTITY) != XML_INTERNAL_PARAMETER_ENTITY) {
              xmlWarningMsg(ctxt,XML_WAR_UNDECLARED_ENTITY,"%%%s; is not a parameter entity\n",
                            pxVar7,(xmlChar *)0x0);
              pxVar8 = local_80;
            }
          }
          pbVar13 = pbVar13 + 1;
          (*xmlFree)(pxVar7);
          buf = local_50;
          if (pxVar8 == (xmlEntityPtr)0x0) {
            return;
          }
          local_90 = pbVar13;
          if ((ctxt->inSubset != 2) &&
             ((pxVar4 = ctxt->input->entity, pxVar4 == (xmlEntityPtr)0x0 ||
              (pxVar4->etype != XML_EXTERNAL_PARAMETER_ENTITY)))) {
            xmlFatalErr(ctxt,XML_ERR_ENTITY_PE_INTERNAL,(char *)0x0);
            return;
          }
          if (pxVar8->content == (xmlChar *)0x0) {
            if (((ctxt->options & 0x800000) == 0) &&
               ((ctxt->replaceEntities != 0 || (ctxt->validate != 0)))) {
              xVar2 = pxVar8->etype;
              if ((xVar2 == XML_EXTERNAL_GENERAL_PARSED_ENTITY) ||
                 (xVar2 == XML_EXTERNAL_PARAMETER_ENTITY)) {
                pxVar9 = xmlLoadResource(ctxt,(char *)pxVar8->URI,(char *)pxVar8->ExternalID,
                                         (xVar2 == XML_EXTERNAL_PARAMETER_ENTITY) +
                                         XML_RESOURCE_GENERAL_ENTITY);
                if (pxVar9 != (xmlParserInputPtr)0x0) {
                  local_58 = ctxt->encoding;
                  local_60 = ctxt->input;
                  local_48._0_4_ = ctxt->inputNr;
                  local_48._4_4_ = ctxt->inputMax;
                  uStack_40 = 0;
                  local_68 = ctxt->inputTab;
                  ctxt->input = (xmlParserInputPtr)0x0;
                  ctxt->inputNr = 0;
                  ctxt->inputMax = 1;
                  ctxt->encoding = (xmlChar *)0x0;
                  ppxVar10 = (xmlParserInputPtr *)(*xmlMalloc)(8);
                  ctxt->inputTab = ppxVar10;
                  if (ppxVar10 == (xmlParserInputPtr *)0x0) {
                    xmlCtxtErrMemory(ctxt);
LAB_001316e0:
                    xmlFreeInputStream(pxVar9);
                  }
                  else {
                    xmlBufResetInput(pxVar9->buf->buffer,pxVar9);
                    iVar5 = xmlCtxtPushInput(ctxt,pxVar9);
                    if (iVar5 < 0) goto LAB_001316e0;
                    xmlDetectEncoding(ctxt);
                    pxVar7 = ctxt->input->cur;
                    if (((((*pxVar7 == '<') && (pxVar7[1] == '?')) && (pxVar7[2] == 'x')) &&
                        ((pxVar7[3] == 'm' && (pxVar7[4] == 'l')))) &&
                       (((ulong)pxVar7[5] < 0x21 &&
                        ((0x100002600U >> ((ulong)pxVar7[5] & 0x3f) & 1) != 0)))) {
                      xmlParseTextDecl(ctxt);
                      iVar5 = xmlStrEqual(ctxt->version,"1.0");
                      if ((iVar5 != 0) &&
                         (iVar5 = xmlStrEqual(ctxt->input->version,"1.0"), iVar5 == 0)) {
                        xmlFatalErrMsg(ctxt,XML_ERR_VERSION_MISMATCH,
                                       "Version mismatch between document and entity\n");
                      }
                    }
                    uVar14 = (long)pxVar9->cur - (long)pxVar9->base;
                    local_88 = pxVar9;
                    xmlBufShrink(pxVar9->buf->buffer,uVar14);
                    uVar12 = uVar14 + ctxt->sizeentities;
                    if (CARRY8(uVar14,ctxt->sizeentities)) {
                      uVar12 = 0xffffffffffffffff;
                    }
                    ctxt->sizeentities = uVar12;
                    do {
                      iVar5 = xmlParserInputBufferGrow(local_88->buf,0x1000);
                    } while (0 < iVar5);
                    xmlBufResetInput(local_88->buf->buffer,local_88);
                    if (iVar5 < 0) {
                      xmlCtxtErrIO(ctxt,local_88->buf->error,(char *)0x0);
                    }
                    else {
                      sVar11 = xmlBufUse(local_88->buf->buffer);
                      if ((sVar11 & 0xffffffff80000000) == 0) {
                        pxVar7 = xmlBufContent(local_88->buf->buffer);
                        local_70 = sVar11;
                        local_88 = (xmlParserInputPtr)xmlStrndup(pxVar7,(int)sVar11);
                        if (local_88 != (xmlParserInputPtr)0x0) {
                          local_80 = pxVar8;
                          for (uVar14 = 0; uVar14 < local_70; uVar14 = uVar14 + (long)(int)local_78)
                          {
                            local_78 = (byte *)CONCAT44(local_78._4_4_,(int)local_70 - (int)uVar14);
                            pbVar13 = (byte *)((long)&local_88->buf + uVar14);
                            uVar6 = xmlGetUTF8Char(pbVar13,(int *)&local_78);
                            if ((int)uVar6 < 0) {
LAB_0013170c:
                              xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,
                                                "xmlLoadEntityContent: invalid char value %d\n",
                                                (uint)*pbVar13);
                              pxVar8 = local_80;
                              goto LAB_0013173a;
                            }
                            if (uVar6 < 0x100) {
                              if ((uVar6 < 0x20) &&
                                 ((0xd < uVar6 || ((0x2600U >> (uVar6 & 0x1f) & 1) == 0))))
                              goto LAB_0013170c;
                            }
                            else if (0xfffff < uVar6 - 0x10000 &&
                                     (0x1ffd < uVar6 - 0xe000 && 0xd7ff < uVar6)) goto LAB_0013170c;
                          }
                          uVar12 = ctxt->sizeentities + local_70;
                          if (CARRY8(ctxt->sizeentities,local_70)) {
                            uVar12 = 0xffffffffffffffff;
                          }
                          ctxt->sizeentities = uVar12;
                          local_80->content = (xmlChar *)local_88;
                          local_80->length = (int)local_70;
                          pxVar8 = local_80;
                          goto LAB_00131701;
                        }
                      }
                      xmlCtxtErrMemory(ctxt);
                    }
                  }
LAB_00131701:
                  local_88 = (xmlParserInputPtr)0x0;
LAB_0013173a:
                  while (0 < ctxt->inputNr) {
                    pxVar9 = xmlCtxtPopInput(ctxt);
                    xmlFreeInputStream(pxVar9);
                  }
                  (*xmlFree)(ctxt->inputTab);
                  (*xmlFree)(ctxt->encoding);
                  ctxt->input = local_60;
                  ctxt->inputNr = (int)local_48;
                  ctxt->inputMax = local_48._4_4_;
                  ctxt->inputTab = local_68;
                  ctxt->encoding = local_58;
                  (*xmlFree)(local_88);
                }
              }
              else {
                xmlFatalErr(ctxt,XML_ERR_ARGUMENT,"xmlLoadEntityContent parameter error");
              }
            }
            else {
              xmlWarningMsg(ctxt,XML_ERR_ENTITY_PROCESSING,
                            "not validating will not read content for PE entity %s\n",pxVar8->name,
                            (xmlChar *)0x0);
            }
          }
          iVar5 = xmlParserEntityCheck(ctxt,(long)pxVar8->length);
          if (iVar5 != 0) {
            return;
          }
          if ((pxVar8->flags & 8U) != 0) {
            xmlFatalErr(ctxt,XML_ERR_ENTITY_LOOP,(char *)0x0);
            xmlHaltParser(ctxt);
            return;
          }
          pxVar8->flags = pxVar8->flags | 8;
          xmlExpandPEsInEntityValue(ctxt,buf,pxVar8->content,pxVar8->length,depth + 1);
          *(byte *)&pxVar8->flags = (byte)pxVar8->flags & 0xf7;
          str = local_90;
        }
        else {
          if ((bVar1 < 0x20) && ((0xd < uVar6 || ((0x2600U >> (uVar6 & 0x1f) & 1) == 0)))) {
            xmlFatalErrMsg(ctxt,XML_ERR_INVALID_CHAR,"invalid character in entity value\n");
            goto LAB_00131694;
          }
          local_90 = local_90 + 1;
        }
      }
    }
    if (str < local_90) {
      xmlSBufAddString(buf,str,iVar5 - iVar15);
    }
  }
  return;
}

Assistant:

static void
xmlExpandPEsInEntityValue(xmlParserCtxtPtr ctxt, xmlSBuf *buf,
                          const xmlChar *str, int length, int depth) {
    int maxDepth = (ctxt->options & XML_PARSE_HUGE) ? 40 : 20;
    const xmlChar *end, *chunk;
    int c, l;

    if (str == NULL)
        return;

    depth += 1;
    if (depth > maxDepth) {
	xmlFatalErrMsg(ctxt, XML_ERR_RESOURCE_LIMIT,
                       "Maximum entity nesting depth exceeded");
	return;
    }

    end = str + length;
    chunk = str;

    while ((str < end) && (!PARSER_STOPPED(ctxt))) {
        c = *str;

        if (c >= 0x80) {
            l = xmlUTF8MultibyteLen(ctxt, str,
                    "invalid character in entity value\n");
            if (l == 0) {
                if (chunk < str)
                    xmlSBufAddString(buf, chunk, str - chunk);
                xmlSBufAddReplChar(buf);
                str += 1;
                chunk = str;
            } else {
                str += l;
            }
        } else if (c == '&') {
            if (str[1] == '#') {
                if (chunk < str)
                    xmlSBufAddString(buf, chunk, str - chunk);

                c = xmlParseStringCharRef(ctxt, &str);
                if (c == 0)
                    return;

                xmlSBufAddChar(buf, c);

                chunk = str;
            } else {
                xmlChar *name;

                /*
                 * General entity references are checked for
                 * syntactic validity.
                 */
                str++;
                name = xmlParseStringName(ctxt, &str);

                if ((name == NULL) || (*str++ != ';')) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_CHAR_ERROR,
                            "EntityValue: '&' forbidden except for entities "
                            "references\n");
                    xmlFree(name);
                    return;
                }

                xmlFree(name);
            }
        } else if (c == '%') {
            xmlEntityPtr ent;

            if (chunk < str)
                xmlSBufAddString(buf, chunk, str - chunk);

            ent = xmlParseStringPEReference(ctxt, &str);
            if (ent == NULL)
                return;

            if (!PARSER_EXTERNAL(ctxt)) {
                xmlFatalErr(ctxt, XML_ERR_ENTITY_PE_INTERNAL, NULL);
                return;
            }

            if (ent->content == NULL) {
                /*
                 * Note: external parsed entities will not be loaded,
                 * it is not required for a non-validating parser to
                 * complete external PEReferences coming from the
                 * internal subset
                 */
                if (((ctxt->options & XML_PARSE_NO_XXE) == 0) &&
                    ((ctxt->replaceEntities) ||
                     (ctxt->validate))) {
                    xmlLoadEntityContent(ctxt, ent);
                } else {
                    xmlWarningMsg(ctxt, XML_ERR_ENTITY_PROCESSING,
                                  "not validating will not read content for "
                                  "PE entity %s\n", ent->name, NULL);
                }
            }

            /*
             * TODO: Skip if ent->content is still NULL.
             */

            if (xmlParserEntityCheck(ctxt, ent->length))
                return;

            if (ent->flags & XML_ENT_EXPANDING) {
                xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
                xmlHaltParser(ctxt);
                return;
            }

            ent->flags |= XML_ENT_EXPANDING;
            xmlExpandPEsInEntityValue(ctxt, buf, ent->content, ent->length,
                                      depth);
            ent->flags &= ~XML_ENT_EXPANDING;

            chunk = str;
        } else {
            /* Normal ASCII char */
            if (!IS_BYTE_CHAR(c)) {
                xmlFatalErrMsg(ctxt, XML_ERR_INVALID_CHAR,
                        "invalid character in entity value\n");
                if (chunk < str)
                    xmlSBufAddString(buf, chunk, str - chunk);
                xmlSBufAddReplChar(buf);
                str += 1;
                chunk = str;
            } else {
                str += 1;
            }
        }
    }

    if (chunk < str)
        xmlSBufAddString(buf, chunk, str - chunk);
}